

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::check_function_return(Generator *top)

{
  undefined1 local_58 [8];
  FunctionReturnVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  FunctionReturnVisitor::FunctionReturnVisitor((FunctionReturnVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  FunctionReturnVisitor::~FunctionReturnVisitor((FunctionReturnVisitor *)local_58);
  return;
}

Assistant:

void check_function_return(Generator* top) {
    FunctionReturnVisitor visitor;
    visitor.visit_generator_root_p(top);
}